

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

void __thiscall Json::FastWriter::~FastWriter(FastWriter *this)

{
  FastWriter *this_local;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__FastWriter_001b1c78;
  std::__cxx11::string::~string((string *)&this->document_);
  Writer::~Writer(&this->super_Writer);
  return;
}

Assistant:

~FastWriter() override = default;